

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawCone
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar height,int upAxis,cbtTransform *transform,
          cbtVector3 *color)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  cbtScalar acVar4 [4];
  cbtScalar cVar5;
  int iVar6;
  long lVar7;
  int i;
  uint uVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined8 uVar26;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar27 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  cbtVector3 cVar33;
  cbtVector3 cVar34;
  float local_f8;
  float fStack_f4;
  cbtVector3 local_e8;
  cbtVector3 local_d8;
  cbtVector3 local_c8;
  undefined1 local_b8 [16];
  long local_a0;
  cbtVector3 local_98;
  cbtScalar local_88 [4];
  cbtScalar local_78 [4];
  cbtVector3 local_68;
  long local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  uVar2 = *(ulong *)(transform->m_origin).m_floats;
  lVar7 = (long)upAxis;
  local_f8 = (float)uVar2;
  fStack_f4 = (float)(uVar2 >> 0x20);
  fVar1 = (transform->m_origin).m_floats[2];
  local_98.m_floats._0_12_ = ZEXT812(0);
  local_98.m_floats[3] = 0.0;
  local_68.m_floats = local_98.m_floats;
  local_68.m_floats[lVar7] = height * 0.5;
  uVar8 = 0;
  local_a0 = (long)((upAxis + 1) % 3);
  local_78 = local_98.m_floats;
  local_78[local_a0] = radius;
  iVar6 = (upAxis + 2) % 3;
  local_88 = local_98.m_floats;
  local_58 = lVar7;
  local_88[iVar6] = radius;
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)(height * 0.5)),auVar9);
  auVar23 = ZEXT1664(auVar9);
  local_98.m_floats[lVar7] = auVar9._0_4_;
  for (; uVar26 = auVar23._8_8_, uVar8 < 0x168; uVar8 = uVar8 + 0x1e) {
    local_b8._0_4_ = (float)(int)uVar8 * 0.017453292;
    fVar10 = sinf((float)(int)uVar8 * 0.017453292);
    local_98.m_floats[local_a0] = fVar10 * radius;
    fVar10 = cosf((float)local_b8._0_4_);
    uVar26 = 0;
    local_98.m_floats[iVar6] = fVar10 * radius;
    cVar33 = ::operator*(&transform->m_basis,&local_68);
    auVar11._0_4_ = cVar33.m_floats[0] + local_f8;
    auVar11._4_4_ = cVar33.m_floats[1] + fStack_f4;
    auVar11._8_4_ = (float)uVar26 + 0.0;
    auVar11._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
    local_c8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar11,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
    uVar26 = local_c8.m_floats._8_8_;
    cVar33 = ::operator*(&transform->m_basis,&local_98);
    auVar12._0_4_ = cVar33.m_floats[0] + local_f8;
    auVar12._4_4_ = cVar33.m_floats[1] + fStack_f4;
    auVar12._8_4_ = (float)uVar26 + 0.0;
    auVar12._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
    local_e8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar12,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
    auVar23 = ZEXT1664((undefined1  [16])local_e8.m_floats);
    (*this->_vptr_cbtIDebugDraw[4])(this,&local_c8,&local_e8,color);
  }
  cVar34 = ::operator*(&transform->m_basis,&local_68);
  cVar33.m_floats = local_68.m_floats;
  acVar4 = local_78;
  auVar13._0_4_ = cVar34.m_floats[0] + local_f8;
  auVar13._4_4_ = cVar34.m_floats[1] + fStack_f4;
  auVar13._8_4_ = (float)uVar26 + 0.0;
  auVar13._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_c8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar13,ZEXT416((uint)(cVar34.m_floats[2] + fVar1)),0x28);
  local_b8._8_8_ = 0;
  local_b8._0_4_ = local_78[0];
  local_b8._4_4_ = local_78[1];
  auVar14._8_8_ = 0;
  auVar14._0_4_ = local_68.m_floats[0];
  auVar14._4_4_ = local_68.m_floats[1];
  auVar9 = vsubps_avx(local_b8,auVar14);
  local_78[2] = acVar4[2];
  cVar5 = local_78[2];
  local_68.m_floats[2] = cVar33.m_floats[2];
  local_d8.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar9,ZEXT416((uint)(local_78[2] - local_68.m_floats[2])),0x28);
  uVar26 = local_d8.m_floats._8_8_;
  local_78 = acVar4;
  local_68.m_floats = cVar33.m_floats;
  cVar33 = ::operator*(&transform->m_basis,&local_d8);
  auVar15._0_4_ = cVar33.m_floats[0] + local_f8;
  auVar15._4_4_ = cVar33.m_floats[1] + fStack_f4;
  auVar15._8_4_ = (float)uVar26 + 0.0;
  auVar15._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_e8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar15,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
  uVar26 = local_e8.m_floats._8_8_;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_c8,&local_e8,color);
  cVar33 = ::operator*(&transform->m_basis,&local_68);
  auVar16._0_4_ = cVar33.m_floats[0] + local_f8;
  auVar16._4_4_ = cVar33.m_floats[1] + fStack_f4;
  auVar16._8_4_ = (float)uVar26 + 0.0;
  auVar16._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_c8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar16,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
  auVar28._0_8_ = local_68.m_floats._0_8_ ^ 0x8000000080000000;
  auVar28._8_4_ = 0x80000000;
  auVar28._12_4_ = 0x80000000;
  auVar9 = vsubps_avx(auVar28,local_b8);
  local_d8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar9,ZEXT416((uint)(-local_68.m_floats[2] - cVar5)),0x28);
  uVar26 = local_d8.m_floats._8_8_;
  cVar33 = ::operator*(&transform->m_basis,&local_d8);
  auVar17._0_4_ = cVar33.m_floats[0] + local_f8;
  auVar17._4_4_ = cVar33.m_floats[1] + fStack_f4;
  auVar17._8_4_ = (float)uVar26 + 0.0;
  auVar17._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_e8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar17,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
  uVar26 = local_e8.m_floats._8_8_;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_c8,&local_e8,color);
  cVar34 = ::operator*(&transform->m_basis,&local_68);
  cVar33.m_floats = local_68.m_floats;
  acVar4 = local_88;
  auVar18._0_4_ = cVar34.m_floats[0] + local_f8;
  auVar18._4_4_ = cVar34.m_floats[1] + fStack_f4;
  auVar18._8_4_ = (float)uVar26 + 0.0;
  auVar18._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_c8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar18,ZEXT416((uint)(cVar34.m_floats[2] + fVar1)),0x28);
  local_b8._8_8_ = 0;
  local_b8._0_4_ = local_88[0];
  local_b8._4_4_ = local_88[1];
  auVar19._8_8_ = 0;
  auVar19._0_4_ = local_68.m_floats[0];
  auVar19._4_4_ = local_68.m_floats[1];
  auVar9 = vsubps_avx(local_b8,auVar19);
  local_88[2] = acVar4[2];
  cVar5 = local_88[2];
  local_68.m_floats[2] = cVar33.m_floats[2];
  local_d8.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar9,ZEXT416((uint)(local_88[2] - local_68.m_floats[2])),0x28);
  uVar26 = local_d8.m_floats._8_8_;
  local_88 = acVar4;
  local_68.m_floats = cVar33.m_floats;
  cVar33 = ::operator*(&transform->m_basis,&local_d8);
  auVar20._0_4_ = cVar33.m_floats[0] + local_f8;
  auVar20._4_4_ = cVar33.m_floats[1] + fStack_f4;
  auVar20._8_4_ = (float)uVar26 + 0.0;
  auVar20._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_e8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar20,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
  uVar26 = local_e8.m_floats._8_8_;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_c8,&local_e8,color);
  cVar33 = ::operator*(&transform->m_basis,&local_68);
  auVar21._0_4_ = cVar33.m_floats[0] + local_f8;
  auVar21._4_4_ = cVar33.m_floats[1] + fStack_f4;
  auVar21._8_4_ = (float)uVar26 + 0.0;
  auVar21._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_c8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar21,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
  auVar29._0_8_ = local_68.m_floats._0_8_ ^ 0x8000000080000000;
  auVar29._8_4_ = 0x80000000;
  auVar29._12_4_ = 0x80000000;
  auVar9 = vsubps_avx(auVar29,local_b8);
  local_d8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar9,ZEXT416((uint)(-local_68.m_floats[2] - cVar5)),0x28);
  uVar26 = local_d8.m_floats._8_8_;
  cVar33 = ::operator*(&transform->m_basis,&local_d8);
  auVar22._0_4_ = cVar33.m_floats[0] + local_f8;
  auVar22._4_4_ = cVar33.m_floats[1] + fStack_f4;
  auVar22._8_4_ = (float)uVar26 + 0.0;
  auVar22._12_4_ = (float)((ulong)uVar26 >> 0x20) + 0.0;
  local_e8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar22,ZEXT416((uint)(cVar33.m_floats[2] + fVar1)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_c8,&local_e8,color);
  auVar27 = ZEXT856(0);
  local_c8.m_floats = (cbtScalar  [4])ZEXT816(0);
  local_e8.m_floats = (cbtScalar  [4])ZEXT816(0);
  local_c8.m_floats[local_58] = 1.0;
  local_e8.m_floats[local_a0] = 1.0;
  cVar33 = ::operator*(&transform->m_basis,&local_68);
  auVar23._0_8_ = cVar33.m_floats._0_8_;
  auVar23._8_56_ = auVar27;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar2;
  auVar9 = vsubps_avx(auVar3,auVar23._0_16_);
  auVar32 = (undefined1  [56])0x0;
  local_d8.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 - cVar33.m_floats[2])),0x28);
  auVar27 = ZEXT856(local_d8.m_floats._8_8_);
  cVar33 = ::operator*(&transform->m_basis,&local_c8);
  auVar30._0_8_ = cVar33.m_floats._8_8_;
  auVar30._8_56_ = auVar32;
  auVar24._0_8_ = cVar33.m_floats._0_8_;
  auVar24._8_56_ = auVar27;
  local_40 = vmovlhps_avx(auVar24._0_16_,auVar30._0_16_);
  auVar27 = ZEXT856(local_40._8_8_);
  cVar33 = ::operator*(&transform->m_basis,&local_e8);
  auVar31._0_8_ = cVar33.m_floats._8_8_;
  auVar31._8_56_ = auVar32;
  auVar25._0_8_ = cVar33.m_floats._0_8_;
  auVar25._8_56_ = auVar27;
  local_50 = vmovlhps_avx(auVar25._0_16_,auVar31._0_16_);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,&local_d8,local_40,local_50,color,0);
  return;
}

Assistant:

virtual void drawCone(cbtScalar radius, cbtScalar height, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		int stepDegrees = 30;
		cbtVector3 start = transform.getOrigin();

		cbtVector3 offsetHeight(0, 0, 0);
		cbtScalar halfHeight = height * cbtScalar(0.5);
		offsetHeight[upAxis] = halfHeight;
		cbtVector3 offsetRadius(0, 0, 0);
		offsetRadius[(upAxis + 1) % 3] = radius;
		cbtVector3 offset2Radius(0, 0, 0);
		offset2Radius[(upAxis + 2) % 3] = radius;

		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = -halfHeight;

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * capEnd, color);
		}

		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight + offsetRadius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight - offsetRadius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight + offset2Radius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight - offset2Radius), color);

		// Drawing the base of the cone
		cbtVector3 yaxis(0, 0, 0);
		yaxis[upAxis] = cbtScalar(1.0);
		cbtVector3 xaxis(0, 0, 0);
		xaxis[(upAxis + 1) % 3] = cbtScalar(1.0);
		drawArc(start - transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, 10.0);
	}